

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O1

void __thiscall irr::COSOperator::COSOperator(COSOperator *this,stringc *osVersion)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->field_0x40 = 0;
  *(undefined4 *)&this->field_0x48 = 1;
  (this->super_IOSOperator)._vptr_IOSOperator = (_func_int **)0x26ef30;
  *(undefined8 *)&this->field_0x38 = 0x26ef88;
  puVar1 = &(this->super_IOSOperator).field_0x8;
  *(undefined1 **)&(this->super_IOSOperator).field_0x8 = &(this->super_IOSOperator).field_0x18;
  *(undefined8 *)&(this->super_IOSOperator).field_0x10 = 0;
  (this->super_IOSOperator).field_0x18 = 0;
  if ((stringc *)puVar1 != osVersion) {
    ::std::__cxx11::string::_M_assign((string *)puVar1);
  }
  this->ClipboardSelectionText = (char *)0x0;
  this->PrimarySelectionText = (char *)0x0;
  return;
}

Assistant:

COSOperator::COSOperator(const core::stringc &osVersion) :
		OperatingSystem(osVersion)
{
#ifdef _DEBUG
	setDebugName("COSOperator");
#endif
}